

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzrule.cpp
# Opt level: O2

UBool __thiscall
icu_63::TimeArrayTimeZoneRule::getPreviousStart
          (TimeArrayTimeZoneRule *this,UDate base,int32_t prevRawOffset,int32_t prevDSTSavings,
          UBool inclusive,UDate *result)

{
  ulong uVar1;
  double dVar2;
  
  uVar1 = (ulong)(uint)this->fNumStartTimes;
  do {
    if ((int)uVar1 < 1) {
      return '\0';
    }
    dVar2 = this->fStartTimes[uVar1 - 1];
    if (this->fTimeRuleType != UTC_TIME) {
      dVar2 = dVar2 - (double)prevRawOffset;
    }
    if (this->fTimeRuleType == WALL_TIME) {
      dVar2 = dVar2 - (double)prevDSTSavings;
    }
  } while ((base <= dVar2) && (uVar1 = uVar1 - 1, inclusive == '\0' || dVar2 != base));
  *result = dVar2;
  return '\x01';
}

Assistant:

UBool
TimeArrayTimeZoneRule::getPreviousStart(UDate base,
                                        int32_t prevRawOffset,
                                        int32_t prevDSTSavings,
                                        UBool inclusive,
                                        UDate& result) const {
    int32_t i = fNumStartTimes - 1;
    for (; i >= 0; i--) {
        UDate time = getUTC(fStartTimes[i], prevRawOffset, prevDSTSavings);
        if (time < base || (inclusive && time == base)) {
            result = time;
            return TRUE;
        }
    }
    return FALSE;
}